

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O0

string * hmac::get_hash(string *input,TypeHash type)

{
  uchar *puVar1;
  uint8_t *message;
  size_t sVar2;
  uchar *in_RCX;
  allocator *md;
  int in_EDX;
  size_t n;
  size_t n_00;
  EVP_PKEY_CTX *pEVar3;
  allocator local_311;
  undefined1 local_310 [8];
  SHA512 ctx_2;
  uchar local_1b8 [8];
  uint8_t digest_2 [64];
  allocator local_169;
  undefined1 auStack_168 [8];
  SHA256 ctx_1;
  char local_a9;
  uchar local_a8 [8];
  uint8_t digest_1 [32];
  undefined1 auStack_78 [8];
  SHA1 ctx;
  uchar local_38 [8];
  uint8_t digest [20];
  TypeHash type_local;
  string *input_local;
  
  if (in_EDX == 0) {
    pEVar3 = (EVP_PKEY_CTX *)(digest + 0xc);
    ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::fill<unsigned_char*,char>
              (local_38,(uchar *)pEVar3,
               (char *)((long)&ctx.m_buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ctx.m_transforms = 0;
    ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ctx.m_h[2] = 0;
    ctx.m_h[3] = 0;
    ctx.m_h[4] = 0;
    ctx._20_4_ = 0;
    auStack_78._0_4_ = 0;
    auStack_78._4_4_ = 0;
    ctx.m_h[0] = 0;
    ctx.m_h[1] = 0;
    ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    hmac_hash::SHA1::SHA1((SHA1 *)auStack_78,(uchar *)pEVar3,n,in_RCX);
    hmac_hash::SHA1::init((SHA1 *)auStack_78,pEVar3);
    puVar1 = (uchar *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    hmac_hash::SHA1::update((SHA1 *)auStack_78,puVar1,sVar2);
    hmac_hash::SHA1::finish((SHA1 *)auStack_78,local_38);
    md = (allocator *)(digest_1 + 0x1b);
    std::allocator<char>::allocator();
    puVar1 = local_38;
    std::__cxx11::string::string((string *)input,(char *)puVar1,0x14,md);
    std::allocator<char>::~allocator((allocator<char> *)(digest_1 + 0x1b));
    hmac_hash::SHA1::~SHA1((SHA1 *)auStack_78,puVar1,n_00,(uchar *)md);
  }
  else if (in_EDX == 1) {
    pEVar3 = (EVP_PKEY_CTX *)(digest_1 + 0x18);
    local_a9 = '\0';
    std::fill<unsigned_char*,char>(local_a8,(uchar *)pEVar3,&local_a9);
    ctx_1.m_h[2] = 0;
    ctx_1.m_h[3] = 0;
    ctx_1.m_h[4] = 0;
    ctx_1.m_h[5] = 0;
    ctx_1.m_block[0x78] = '\0';
    ctx_1.m_block[0x79] = '\0';
    ctx_1.m_block[0x7a] = '\0';
    ctx_1.m_block[0x7b] = '\0';
    ctx_1.m_block[0x7c] = '\0';
    ctx_1.m_block[0x7d] = '\0';
    ctx_1.m_block[0x7e] = '\0';
    ctx_1.m_block[0x7f] = '\0';
    ctx_1.m_h[0] = 0;
    ctx_1.m_h[1] = 0;
    ctx_1.m_block[0x68] = '\0';
    ctx_1.m_block[0x69] = '\0';
    ctx_1.m_block[0x6a] = '\0';
    ctx_1.m_block[0x6b] = '\0';
    ctx_1.m_block[0x6c] = '\0';
    ctx_1.m_block[0x6d] = '\0';
    ctx_1.m_block[0x6e] = '\0';
    ctx_1.m_block[0x6f] = '\0';
    ctx_1.m_block[0x70] = '\0';
    ctx_1.m_block[0x71] = '\0';
    ctx_1.m_block[0x72] = '\0';
    ctx_1.m_block[0x73] = '\0';
    ctx_1.m_block[0x74] = '\0';
    ctx_1.m_block[0x75] = '\0';
    ctx_1.m_block[0x76] = '\0';
    ctx_1.m_block[0x77] = '\0';
    ctx_1.m_block[0x58] = '\0';
    ctx_1.m_block[0x59] = '\0';
    ctx_1.m_block[0x5a] = '\0';
    ctx_1.m_block[0x5b] = '\0';
    ctx_1.m_block[0x5c] = '\0';
    ctx_1.m_block[0x5d] = '\0';
    ctx_1.m_block[0x5e] = '\0';
    ctx_1.m_block[0x5f] = '\0';
    ctx_1.m_block[0x60] = '\0';
    ctx_1.m_block[0x61] = '\0';
    ctx_1.m_block[0x62] = '\0';
    ctx_1.m_block[99] = '\0';
    ctx_1.m_block[100] = '\0';
    ctx_1.m_block[0x65] = '\0';
    ctx_1.m_block[0x66] = '\0';
    ctx_1.m_block[0x67] = '\0';
    ctx_1.m_block[0x48] = '\0';
    ctx_1.m_block[0x49] = '\0';
    ctx_1.m_block[0x4a] = '\0';
    ctx_1.m_block[0x4b] = '\0';
    ctx_1.m_block[0x4c] = '\0';
    ctx_1.m_block[0x4d] = '\0';
    ctx_1.m_block[0x4e] = '\0';
    ctx_1.m_block[0x4f] = '\0';
    ctx_1.m_block[0x50] = '\0';
    ctx_1.m_block[0x51] = '\0';
    ctx_1.m_block[0x52] = '\0';
    ctx_1.m_block[0x53] = '\0';
    ctx_1.m_block[0x54] = '\0';
    ctx_1.m_block[0x55] = '\0';
    ctx_1.m_block[0x56] = '\0';
    ctx_1.m_block[0x57] = '\0';
    ctx_1.m_block[0x38] = '\0';
    ctx_1.m_block[0x39] = '\0';
    ctx_1.m_block[0x3a] = '\0';
    ctx_1.m_block[0x3b] = '\0';
    ctx_1.m_block[0x3c] = '\0';
    ctx_1.m_block[0x3d] = '\0';
    ctx_1.m_block[0x3e] = '\0';
    ctx_1.m_block[0x3f] = '\0';
    ctx_1.m_block[0x40] = '\0';
    ctx_1.m_block[0x41] = '\0';
    ctx_1.m_block[0x42] = '\0';
    ctx_1.m_block[0x43] = '\0';
    ctx_1.m_block[0x44] = '\0';
    ctx_1.m_block[0x45] = '\0';
    ctx_1.m_block[0x46] = '\0';
    ctx_1.m_block[0x47] = '\0';
    ctx_1.m_block[0x28] = '\0';
    ctx_1.m_block[0x29] = '\0';
    ctx_1.m_block[0x2a] = '\0';
    ctx_1.m_block[0x2b] = '\0';
    ctx_1.m_block[0x2c] = '\0';
    ctx_1.m_block[0x2d] = '\0';
    ctx_1.m_block[0x2e] = '\0';
    ctx_1.m_block[0x2f] = '\0';
    ctx_1.m_block[0x30] = '\0';
    ctx_1.m_block[0x31] = '\0';
    ctx_1.m_block[0x32] = '\0';
    ctx_1.m_block[0x33] = '\0';
    ctx_1.m_block[0x34] = '\0';
    ctx_1.m_block[0x35] = '\0';
    ctx_1.m_block[0x36] = '\0';
    ctx_1.m_block[0x37] = '\0';
    ctx_1.m_block[0x18] = '\0';
    ctx_1.m_block[0x19] = '\0';
    ctx_1.m_block[0x1a] = '\0';
    ctx_1.m_block[0x1b] = '\0';
    ctx_1.m_block[0x1c] = '\0';
    ctx_1.m_block[0x1d] = '\0';
    ctx_1.m_block[0x1e] = '\0';
    ctx_1.m_block[0x1f] = '\0';
    ctx_1.m_block[0x20] = '\0';
    ctx_1.m_block[0x21] = '\0';
    ctx_1.m_block[0x22] = '\0';
    ctx_1.m_block[0x23] = '\0';
    ctx_1.m_block[0x24] = '\0';
    ctx_1.m_block[0x25] = '\0';
    ctx_1.m_block[0x26] = '\0';
    ctx_1.m_block[0x27] = '\0';
    ctx_1.m_block[8] = '\0';
    ctx_1.m_block[9] = '\0';
    ctx_1.m_block[10] = '\0';
    ctx_1.m_block[0xb] = '\0';
    ctx_1.m_block[0xc] = '\0';
    ctx_1.m_block[0xd] = '\0';
    ctx_1.m_block[0xe] = '\0';
    ctx_1.m_block[0xf] = '\0';
    ctx_1.m_block[0x10] = '\0';
    ctx_1.m_block[0x11] = '\0';
    ctx_1.m_block[0x12] = '\0';
    ctx_1.m_block[0x13] = '\0';
    ctx_1.m_block[0x14] = '\0';
    ctx_1.m_block[0x15] = '\0';
    ctx_1.m_block[0x16] = '\0';
    ctx_1.m_block[0x17] = '\0';
    ctx_1.m_len = 0;
    ctx_1.m_block[0] = '\0';
    ctx_1.m_block[1] = '\0';
    ctx_1.m_block[2] = '\0';
    ctx_1.m_block[3] = '\0';
    ctx_1.m_block[4] = '\0';
    ctx_1.m_block[5] = '\0';
    ctx_1.m_block[6] = '\0';
    ctx_1.m_block[7] = '\0';
    auStack_168 = (undefined1  [8])0x0;
    ctx_1.m_tot_len = 0;
    hmac_hash::SHA256::init((SHA256 *)auStack_168,pEVar3);
    puVar1 = (uchar *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    hmac_hash::SHA256::update((SHA256 *)auStack_168,puVar1,sVar2);
    hmac_hash::SHA256::finish((SHA256 *)auStack_168,local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)input,(char *)local_a8,0x20,&local_169);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  else if (in_EDX == 2) {
    ctx_2.m_h[7]._7_1_ = 0;
    std::fill<unsigned_char*,char>(local_1b8,digest_2 + 0x38,(char *)((long)ctx_2.m_h + 0x3f));
    pEVar3 = (EVP_PKEY_CTX *)0x0;
    memset((SHA512 *)local_310,0,0x150);
    hmac_hash::SHA512::init((SHA512 *)local_310,pEVar3);
    message = (uint8_t *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    hmac_hash::SHA512::update((SHA512 *)local_310,message,sVar2);
    hmac_hash::SHA512::finish((SHA512 *)local_310,local_1b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)input,(char *)local_1b8,0x40,&local_311);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
  }
  else {
    std::__cxx11::string::string((string *)input);
  }
  return input;
}

Assistant:

std::string get_hash(const std::string &input, TypeHash type) {
        switch(type) {
            case TypeHash::SHA1: {
                uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');
                hmac_hash::SHA1 ctx = hmac_hash::SHA1();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA1::DIGEST_SIZE);
            }
            case TypeHash::SHA256: {
                uint8_t digest[hmac_hash::SHA256::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA256::DIGEST_SIZE, '\0');
                hmac_hash::SHA256 ctx = hmac_hash::SHA256();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA256::DIGEST_SIZE);
            }
            case TypeHash::SHA512: {
                uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
                hmac_hash::SHA512 ctx = hmac_hash::SHA512();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA512::DIGEST_SIZE);
            }
            default: break;
        };
        return std::string();
    }